

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O3

void * P33xThread(void *pParam)

{
  int iVar1;
  long lVar2;
  undefined4 uVar3;
  CRITICAL_SECTION *__mutex;
  timespec local_50;
  double local_40;
  double local_38;
  
  __mutex = P33xCS;
  lVar2 = 0;
  do {
    if (*(void **)((long)addrsP33x + lVar2 * 2) == pParam) {
      uVar3 = 0;
      do {
        iVar1 = *(int *)((long)pParam + 0x538);
        local_50.tv_sec = (__time_t)(iVar1 / 2000);
        local_50.tv_nsec =
             (long)(int)((iVar1 / 2 +
                         ((uint)((ulong)((long)(iVar1 / 2) * 0x10624dd3) >> 0x26) -
                         (iVar1 - (iVar1 >> 0x1f) >> 0x1f)) * -1000) * 1000000);
        nanosleep(&local_50,(timespec *)0x0);
        local_50.tv_sec = local_50.tv_sec & 0xffffffff00000000;
        iVar1 = ReadChannelP33x((P33X *)pParam,'\x01',(float *)&local_50);
        if (iVar1 == 0) {
          local_38 = (double)(float)local_50.tv_sec;
          *(double *)((long)pParam + 800) = local_38;
        }
        else {
          uVar3 = 1;
          local_38 = 0.0;
        }
        iVar1 = *(int *)((long)pParam + 0x538);
        local_50.tv_sec = (__time_t)(iVar1 / 2000);
        local_50.tv_nsec =
             (long)(int)((iVar1 / 2 +
                         ((uint)((ulong)((long)(iVar1 / 2) * 0x10624dd3) >> 0x26) -
                         (iVar1 - (iVar1 >> 0x1f) >> 0x1f)) * -1000) * 1000000);
        nanosleep(&local_50,(timespec *)0x0);
        local_50.tv_sec = local_50.tv_sec & 0xffffffff00000000;
        iVar1 = ReadChannelP33x((P33X *)pParam,'\x04',(float *)&local_50);
        if (iVar1 == 0) {
          local_40 = (double)(float)local_50.tv_sec;
          *(double *)((long)pParam + 0x328) = local_40;
        }
        else {
          uVar3 = 1;
          local_40 = 0.0;
        }
        pthread_mutex_lock((pthread_mutex_t *)__mutex);
        *(double *)((long)pressureP33x + lVar2 * 2) = local_38;
        *(double *)((long)temperatureP33x + lVar2 * 2) = local_40;
        *(undefined4 *)((long)resP33x + lVar2) = uVar3;
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      } while (*(int *)((long)bExitP33x + lVar2) == 0);
      return (void *)0x0;
    }
    __mutex = __mutex + 1;
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x40);
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE P33xThread(void* pParam)
{
	P33X* pP33x = (P33X*)pParam;
	int id = 0, res = EXIT_FAILURE, err = EXIT_SUCCESS;
	double pressure = 0, temperature = 0;

	while (addrsP33x[id] != pP33x)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return 0;
	}

	for (;;)
	{
		mSleep(pP33x->threadperiod/2);
		pressure = 0;
		res = GetPressureP33x(pP33x, &pressure);
		if (res != EXIT_SUCCESS) err = res;
		mSleep(pP33x->threadperiod/2);
		temperature = 0;
		res = GetTemperatureP33x(pP33x, &temperature);
		if (res != EXIT_SUCCESS) err = res;
		EnterCriticalSection(&P33xCS[id]);
		pressureP33x[id] = pressure;
		temperatureP33x[id] = temperature;
		resP33x[id] = err;
		LeaveCriticalSection(&P33xCS[id]);
		if (bExitP33x[id]) break;
	}

	return 0;
}